

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O1

void duckdb::Node16::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  type paVar3;
  long *plVar4;
  pointer this;
  data_ptr_t pdVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  Node node16;
  IndexPointer local_38;
  
  uVar1 = (node->super_IndexPointer).data;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar3->_M_elems[3].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar6 = uVar1 & 0xffffffff;
  plVar4 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     (uVar6 % *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar7 = (long *)*plVar4; uVar6 != plVar7[1]; plVar7 = (long *)*plVar7) {
    plVar4 = plVar7;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar4 + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this,true);
  lVar8 = (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  if (pdVar5[(_Var2._M_head_impl)->bitmask_offset + lVar8] == '\x10') {
    local_38.data = (node->super_IndexPointer).data;
    Node48::GrowNode16(art,node,(Node *)&local_38);
    Node48::InsertChild(art,node,byte,child);
    return;
  }
  BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::InsertChildInternal
            ((BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *)
             (pdVar5 + (_Var2._M_head_impl)->bitmask_offset + lVar8),byte,child);
  return;
}

Assistant:

void Node16::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	// The node is full. Grow to Node48.
	auto &n16 = Node::Ref<Node16>(art, node, NODE_16);
	if (n16.count == CAPACITY) {
		auto node16 = node;
		Node48::GrowNode16(art, node, node16);
		Node48::InsertChild(art, node, byte, child);
		return;
	}

	InsertChildInternal(n16, byte, child);
}